

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib583.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  int stillRunning;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                  ,0x28,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                    ,0x2a);
      iVar2 = 0x7b;
      lVar6 = 0;
    }
    else {
      lVar6 = curl_easy_init();
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                      ,0x2c);
        iVar2 = 0x7c;
      }
      else {
        iVar3 = curl_easy_setopt(lVar6,0x2715,libtest_arg2);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                        ,0x2e,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar6,0x27a8,"curl_client_key.pub");
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                          ,0x2f,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_easy_setopt(lVar6,0x27a9,"curl_client_key");
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                            ,0x30,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar3 = curl_easy_setopt(lVar6,0x2e,1);
              uVar1 = _stderr;
              iVar2 = 0;
              if (iVar3 != 0) {
                uVar4 = curl_easy_strerror(iVar3);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                              ,0x32,iVar3,uVar4);
                iVar2 = iVar3;
              }
              if (iVar2 == 0) {
                iVar3 = curl_easy_setopt(lVar6,0x29,1);
                uVar1 = _stderr;
                iVar2 = 0;
                if (iVar3 != 0) {
                  uVar4 = curl_easy_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                ,0x33,iVar3,uVar4);
                  iVar2 = iVar3;
                }
                if (iVar2 == 0) {
                  iVar3 = curl_easy_setopt(lVar6,0x2712,URL);
                  uVar1 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar4 = curl_easy_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                  ,0x35,iVar3,uVar4);
                    iVar2 = iVar3;
                  }
                  if (iVar2 == 0) {
                    iVar3 = curl_easy_setopt(lVar6,0xe,5);
                    uVar1 = _stderr;
                    iVar2 = 0;
                    if (iVar3 != 0) {
                      uVar4 = curl_easy_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                    ,0x36,iVar3,uVar4);
                      iVar2 = iVar3;
                    }
                    if (iVar2 == 0) {
                      iVar2 = curl_multi_add_handle(lVar5,lVar6);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        iVar2 = 0;
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                      ,0x38,iVar2,uVar4);
                      }
                      if (iVar2 == 0) {
                        iVar2 = 0;
                        curl_mfprintf(_stderr,"curl_multi_perform()...\n");
                        iVar3 = curl_multi_perform(lVar5,&local_34);
                        uVar1 = _stderr;
                        if (iVar3 == 0) {
                          if (local_34 < 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                          ,0x3f);
                            iVar2 = 0x7a;
                          }
                        }
                        else {
                          uVar4 = curl_multi_strerror(iVar3);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                        ,0x3f,iVar3,uVar4);
                          iVar2 = iVar3;
                        }
                        if (iVar2 == 0) {
                          iVar2 = 0;
                          curl_mfprintf(_stderr,"curl_multi_perform() succeeded\n");
                          curl_mfprintf(_stderr,"curl_multi_remove_handle()...\n");
                          iVar3 = curl_multi_remove_handle(lVar5,lVar6);
                          if (iVar3 == 0) {
                            curl_mfprintf(_stderr,"curl_multi_remove_handle() succeeded\n");
                          }
                          else {
                            curl_mfprintf(_stderr,
                                          "curl_multi_remove_handle() failed, with code %d\n",iVar3)
                            ;
                            iVar2 = iVar3;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar6);
    curl_multi_cleanup(lVar5);
    curl_global_cleanup();
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int stillRunning;
  CURLM *multiHandle = NULL;
  CURL *curl = NULL;
  CURLMcode res = CURLM_OK;

  global_init(CURL_GLOBAL_ALL);

  multi_init(multiHandle);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg2);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");

  easy_setopt(curl, CURLOPT_UPLOAD, 1L);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_INFILESIZE, (long)5);

  multi_add_handle(multiHandle, curl);

  /* this tests if removing an easy handle immediately after multi
     perform has been called succeeds or not. */

  fprintf(stderr, "curl_multi_perform()...\n");

  multi_perform(multiHandle, &stillRunning);

  fprintf(stderr, "curl_multi_perform() succeeded\n");

  fprintf(stderr, "curl_multi_remove_handle()...\n");
  res = curl_multi_remove_handle(multiHandle, curl);
  if(res)
    fprintf(stderr, "curl_multi_remove_handle() failed, "
            "with code %d\n", (int)res);
  else
    fprintf(stderr, "curl_multi_remove_handle() succeeded\n");

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(multiHandle);
  curl_global_cleanup();

  return (int)res;
}